

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

bool __thiscall Js::AsmJsType::isSubType(AsmJsType *this,AsmJsType type)

{
  Which WVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar2 = 0;
  switch(type.which_) {
  case Int:
    if (this->which_ < Intish) {
      bVar2 = (byte)(0xe01 >> ((byte)this->which_ & 0x1f));
      break;
    }
    goto LAB_00965b43;
  case Double:
    bVar3 = this->which_ == DoubleLit;
    bVar4 = this->which_ == Double;
    goto LAB_00965b2f;
  case Float:
    bVar2 = this->which_ == Float;
    break;
  case MaybeDouble:
    bVar3 = this->which_ == Double;
    bVar4 = (this->which_ & ~Int64) == MaybeDouble;
    goto LAB_00965b2f;
  case DoubleLit:
    bVar2 = this->which_ == DoubleLit;
    break;
  case MaybeFloat:
    bVar3 = this->which_ == Float;
    bVar4 = this->which_ == MaybeFloat;
    goto LAB_00965b2f;
  case Floatish:
    bVar3 = this->which_ == MaybeFloat;
    bVar4 = (this->which_ & ~MaybeDouble) == Float;
LAB_00965b2f:
    bVar2 = bVar4 | bVar3;
    break;
  case FloatishDoubleLit:
    if (this->which_ < FloatishDoubleLit) {
      bVar2 = 0xe8 >> ((byte)this->which_ & 0x1f);
      break;
    }
LAB_00965b43:
    bVar2 = 0;
    break;
  case Fixnum:
    bVar2 = this->which_ == Fixnum;
    break;
  case Signed:
    bVar2 = this->which_ - Fixnum < 2;
    break;
  case Unsigned:
    bVar2 = (this->which_ & ~Double) == Fixnum;
    break;
  case Intish:
    WVar1 = this->which_;
    bVar2 = (byte)(0xe01 >> ((byte)WVar1 & 0x1f)) & WVar1 < Intish | WVar1 == Intish;
    break;
  case Void:
    bVar2 = this->which_ == Void;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool AsmJsType::isSubType(AsmJsType type) const
    {
        switch (type.which_)
        {
        case Js::AsmJsType::Double:
            return isDouble();
            break;

        case Js::AsmJsType::MaybeDouble:
            return isMaybeDouble();
            break;
        case Js::AsmJsType::DoubleLit:
            return isDoubleLit();
            break;
        case Js::AsmJsType::Float:
            return isFloat();
            break;
        case Js::AsmJsType::MaybeFloat:
            return isMaybeFloat();
            break;
        case Js::AsmJsType::Floatish:
            return isFloatish();
            break;
        case Js::AsmJsType::FloatishDoubleLit:
            return isFloatishDoubleLit();
            break;
        case Js::AsmJsType::Fixnum:
            return which_ == Fixnum;
            break;
        case Js::AsmJsType::Int:
            return isInt();
            break;
        case Js::AsmJsType::Signed:
            return isSigned();
            break;
        case Js::AsmJsType::Unsigned:
            return isUnsigned();
            break;
        case Js::AsmJsType::Intish:
            return isIntish();
            break;
        case Js::AsmJsType::Void:
            return isVoid();
            break;
        default:
            break;
        }
        return false;
    }